

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void highbd_convolve_add_src_horiz_hip
               (uint8_t *src8,ptrdiff_t src_stride,uint16_t *dst,ptrdiff_t dst_stride,
               InterpKernel *x_filters,int x0_q4,int x_step_q4,int w,int h,int round0_bits,int bd)

{
  ushort uVar1;
  int iVar2;
  uint16_t *a;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  int sum;
  int rounding;
  int16_t *x_filter;
  uint16_t *src_x;
  byte in_stack_00000020;
  int x;
  int x_q4;
  int y;
  uint16_t *src;
  int extraprec_clamp_limit;
  int local_44;
  uint local_40;
  int local_3c;
  long local_38;
  long local_18;
  
  local_38 = in_RDI * 2 + -6;
  local_18 = in_RDX;
  for (local_3c = 0; local_3c < (int)src_x; local_3c = local_3c + 1) {
    local_40 = in_R9D;
    for (local_44 = 0; local_44 < (int)x_filter; local_44 = local_44 + 1) {
      a = (uint16_t *)(local_38 + (long)((int)local_40 >> 4) * 2);
      uVar1 = a[3];
      iVar2 = highbd_horz_scalar_product(a,(int16_t *)(in_R8 + (long)(int)(local_40 & 0xf) * 0x10));
      iVar2 = clamp((int)(iVar2 + (uint)uVar1 * 0x80 + (1 << ((char)x_q4 + 6U & 0x1f)) +
                         ((1 << (in_stack_00000020 & 0x1f)) >> 1)) >> (in_stack_00000020 & 0x1f),0,
                    (1 << (((char)x_q4 + '\b') - in_stack_00000020 & 0x1f)) + -1);
      *(short *)(local_18 + (long)local_44 * 2) = (short)iVar2;
      local_40 = sum + local_40;
    }
    local_38 = in_RSI * 2 + local_38;
    local_18 = in_RCX * 2 + local_18;
  }
  return;
}

Assistant:

static void highbd_convolve_add_src_horiz_hip(
    const uint8_t *src8, ptrdiff_t src_stride, uint16_t *dst,
    ptrdiff_t dst_stride, const InterpKernel *x_filters, int x0_q4,
    int x_step_q4, int w, int h, int round0_bits, int bd) {
  const int extraprec_clamp_limit = WIENER_CLAMP_LIMIT(round0_bits, bd);
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  src -= SUBPEL_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_q4 = x0_q4;
    for (int x = 0; x < w; ++x) {
      const uint16_t *const src_x = &src[x_q4 >> SUBPEL_BITS];
      const int16_t *const x_filter = x_filters[x_q4 & SUBPEL_MASK];
      const int rounding = ((int)src_x[SUBPEL_TAPS / 2 - 1] << FILTER_BITS) +
                           (1 << (bd + FILTER_BITS - 1));
      const int sum = highbd_horz_scalar_product(src_x, x_filter) + rounding;
      dst[x] = (uint16_t)clamp(ROUND_POWER_OF_TWO(sum, round0_bits), 0,
                               extraprec_clamp_limit - 1);
      x_q4 += x_step_q4;
    }
    src += src_stride;
    dst += dst_stride;
  }
}